

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

void cpu_get_tb_cpu_state
               (CPUTriCoreState *env,target_ulong_conflict *pc,target_ulong_conflict *cs_base,
               uint32_t *flags)

{
  uint32_t *flags_local;
  target_ulong_conflict *cs_base_local;
  target_ulong_conflict *pc_local;
  CPUTriCoreState *env_local;
  
  *pc = env->PC;
  *cs_base = 0;
  *flags = 0;
  return;
}

Assistant:

static inline void cpu_get_tb_cpu_state(CPUM68KState *env, target_ulong *pc,
                                        target_ulong *cs_base, uint32_t *flags)
{
    *pc = env->pc;
    *cs_base = 0;
    *flags = (env->macsr >> 4) & TB_FLAGS_MACSR;
    if (env->sr & SR_S) {
        *flags |= TB_FLAGS_MSR_S;
        *flags |= (env->sfc << (TB_FLAGS_SFC_S_BIT - 2)) & TB_FLAGS_SFC_S;
        *flags |= (env->dfc << (TB_FLAGS_DFC_S_BIT - 2)) & TB_FLAGS_DFC_S;
    }
}